

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O2

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  uint uVar2;
  UInt16 *pUVar3;
  ELzmaDummy EVar4;
  int iVar5;
  uint uVar6;
  Byte *bufLimit;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  SizeT inSize;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    if (p->remainLen == 0x112) {
      uVar6 = 1;
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
        uVar6 = (uint)(p->code != 0);
      }
      return uVar6;
    }
    if (p->needFlush != 0) {
      while( true ) {
        uVar6 = p->tempBufSize;
        if (inSize == 0) break;
        if (4 < uVar6) goto LAB_00179c03;
        BVar1 = *src;
        src = src + 1;
        p->tempBufSize = uVar6 + 1;
        p->tempBuf[uVar6] = BVar1;
        *srcLen = *srcLen + 1;
        inSize = inSize - 1;
      }
      if (uVar6 < 5) goto LAB_00179e27;
LAB_00179c03:
      if (*buf != '\0') {
        return 1;
      }
      uVar6 = *(uint *)(p->tempBuf + 1);
      p->code = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      p->range = 0xffffffff;
      p->needFlush = 0;
      p->tempBufSize = 0;
    }
    uVar8 = p->dicPos;
    if (dicLimit <= uVar8) {
      if (p->remainLen != 0) {
        if (finishMode == LZMA_FINISH_ANY) {
LAB_00179ded:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 0;
        }
        goto LAB_00179dde;
      }
      if (p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return 0;
      }
      if (finishMode == LZMA_FINISH_ANY) goto LAB_00179ded;
    }
    if (p->needInitState != 0) {
      uVar6 = (p->prop).lp;
      uVar2 = (p->prop).lc;
      pUVar3 = p->probs;
      for (uVar9 = 0; (0x300 << ((char)uVar6 + (char)uVar2 & 0x1fU)) + 0x736 != uVar9;
          uVar9 = uVar9 + 1) {
        pUVar3[uVar9] = 0x400;
      }
      p->reps[3] = 1;
      p->state = 0;
      p->reps[0] = 1;
      p->reps[1] = 1;
      p->reps[2] = 1;
      p->needInitState = 0;
    }
    uVar9 = (ulong)p->tempBufSize;
    if (uVar9 == 0) {
      if (inSize < 0x14 || dicLimit <= uVar8) {
        EVar4 = LzmaDec_TryDummy(p,src,inSize);
        if (EVar4 == DUMMY_ERROR) {
          memcpy(buf,src,inSize);
          p->tempBufSize = (uint)inSize;
          *srcLen = *srcLen + inSize;
          goto LAB_00179e27;
        }
        bufLimit = src;
        if ((dicLimit <= uVar8) && (EVar4 != DUMMY_MATCH)) goto LAB_00179dde;
      }
      else {
        bufLimit = src + (inSize - 0x14);
      }
      p->buf = src;
      iVar5 = LzmaDec_DecodeReal2(p,dicLimit,bufLimit);
      if (iVar5 != 0) {
        return 1;
      }
      uVar8 = (long)p->buf - (long)src;
      *srcLen = *srcLen + uVar8;
    }
    else {
      for (uVar7 = 0; (uVar9 < 0x14 && (uVar7 < inSize)); uVar7 = uVar7 + 1) {
        p->tempBuf[uVar9] = src[uVar7];
        uVar9 = uVar9 + 1;
      }
      p->tempBufSize = (uint)uVar9;
      if (dicLimit <= uVar8 || uVar9 < 0x14) {
        EVar4 = LzmaDec_TryDummy(p,buf,uVar9);
        if (EVar4 == DUMMY_ERROR) {
          *srcLen = *srcLen + uVar7;
LAB_00179e27:
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if ((dicLimit <= uVar8) && (EVar4 != DUMMY_MATCH)) {
LAB_00179dde:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 1;
        }
      }
      p->buf = buf;
      iVar5 = LzmaDec_DecodeReal2(p,dicLimit,buf);
      if (iVar5 != 0) {
        return 1;
      }
      uVar8 = (ulong)(((int)uVar7 - (uint)uVar9) + (*(int *)&p->buf - (int)buf));
      *srcLen = *srcLen + uVar8;
      p->tempBufSize = 0;
    }
    src = src + uVar8;
    inSize = inSize - uVar8;
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}